

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O0

TPZFMatrix<long_double> * __thiscall
TPZFMatrix<long_double>::operator-=(TPZFMatrix<long_double> *this,longdouble val)

{
  TPZFMatrix<long_double> *pTVar1;
  undefined8 unaff_retaddr;
  undefined2 in_stack_00000008;
  
  pTVar1 = operator+=(SUB108(val,0),(longdouble)CONCAT28(in_stack_00000008,unaff_retaddr));
  return pTVar1;
}

Assistant:

TPZFMatrix<TVar> &operator-=(const TVar val )  { return operator+=( -val ); }